

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msg_tracing_helpers.hpp
# Opt level: O1

void so_5::impl::msg_tracing_helpers::details::
     make_trace_to<so_5::impl::msg_tracing_helpers::details::overlimit_deep_const&,so_5::agent_t_const*&,so_5::impl::msg_tracing_helpers::details::text_separator,so_5::abstract_message_box_t&,std::type_index_const&,so_5::intrusive_ptr_t<so_5::message_t>const&>
               (ostream *s,overlimit_deep *a,agent_t **other,text_separator *other_1,
               abstract_message_box_t *other_2,type_index *other_3,
               intrusive_ptr_t<so_5::message_t> *other_4)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(s,"[overlimit_deep=",0x10);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)s);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]",1);
  make_trace_to<so_5::agent_t_const*&,so_5::impl::msg_tracing_helpers::details::text_separator,so_5::abstract_message_box_t&,std::type_index_const&,so_5::intrusive_ptr_t<so_5::message_t>const&>
            (s,other,other_1,other_2,other_3,other_4);
  return;
}

Assistant:

void
make_trace_to( std::ostream & s, A && a, OTHER &&... other )
	{
		make_trace_to_1( s, std::forward< A >(a) );
		make_trace_to( s, std::forward< OTHER >(other)... );
	}